

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,2,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<float,deqp::gls::BuiltinPrecisionTests::Void>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  bool *pbVar1;
  _Rb_tree_node_base *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  float fVar4;
  pointer pMVar5;
  pointer pMVar6;
  Variable<tcu::Matrix<float,_2,_2>_> *pVVar7;
  pointer pcVar8;
  Variable<float> *pVVar9;
  PrecisionCase *pPVar10;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pVVar11;
  FloatFormat *fmt;
  undefined8 uVar12;
  ContextType type;
  int iVar13;
  _Rb_tree_node_base *p_Var14;
  char *pcVar15;
  size_t sVar16;
  long *plVar17;
  ShaderExecutor *pSVar18;
  Interval *pIVar19;
  IVal *x;
  TestError *this_00;
  uint uVar20;
  TestLog *pTVar21;
  undefined1 *puVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  IVal IVar26;
  bool bVar27;
  double dVar28;
  double dVar29;
  IVal reference1;
  IVal in2;
  FuncSet funcs;
  IVal in3;
  ostringstream os;
  Environment env;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  outputs;
  FloatFormat highpFmt;
  ShaderSpec spec;
  ostringstream oss;
  undefined1 auStack_4e8 [8];
  PrecisionCase *local_4e0;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_4d8;
  IVal local_4c9;
  Statement *local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4c0;
  string local_4b8;
  undefined1 local_498 [32];
  _Rb_tree_node_base *local_478;
  size_t local_470;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_468;
  FloatFormat *local_460;
  IVal local_458;
  ulong local_440;
  ulong local_438;
  ResultCollector *local_430;
  undefined1 local_428 [8];
  undefined1 auStack_420 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  double local_408;
  Data local_400;
  undefined4 local_3f0;
  ios_base local_3b8 [8];
  ios_base local_3b0 [264];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2a8;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  local_278;
  FloatFormat local_248;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  
  pMVar5 = (inputs->in0).
           super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pMVar6 = (inputs->in0).
           super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar24 = (long)pMVar6 - (long)pMVar5 >> 4;
  local_4d8 = variables;
  local_4c8 = stmt;
  local_468 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Outputs(&local_278,uVar24);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_248.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_248.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_248.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_248.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_248.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_248.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_248.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_248.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_248._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2a8._M_impl.super__Rb_tree_header._M_header;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_428 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_4e0 = this;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2a8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_420);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_420,"Statement: ",0xb);
  (*local_4c8->_vptr_Statement[2])(local_4c8,(ostringstream *)auStack_420);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_428,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_420);
  std::ios_base::~ios_base(local_3b0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var2 = (_Rb_tree_node_base *)(local_498 + 8);
  local_498._8_4_ = _S_red;
  local_498._16_8_ = (_Base_ptr)0x0;
  local_470 = 0;
  local_498._24_8_ = p_Var2;
  local_478 = p_Var2;
  (*local_4c8->_vptr_Statement[4])(local_4c8,local_498);
  if ((_Rb_tree_node_base *)local_498._24_8_ != p_Var2) {
    p_Var14 = (_Rb_tree_node_base *)local_498._24_8_;
    do {
      (**(code **)(**(long **)(p_Var14 + 1) + 0x30))(*(long **)(p_Var14 + 1),local_1a8);
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    } while (p_Var14 != p_Var2);
  }
  if (local_470 != 0) {
    local_428 = (undefined1  [8])((local_4e0->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_420);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_420,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_420,local_4b8._M_dataplus._M_p,local_4b8._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_428,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
      operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_420);
    std::ios_base::~ios_base(local_3b0);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_498);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_428,"precision ",10);
  pcVar15 = glu::getPrecisionName((local_4e0->m_ctx).precision);
  if (pcVar15 == (char *)0x0) {
    std::ios::clear((int)(auStack_4e8 + (long)((TestLog *)((long)local_428 + -0x18))->m_log) + 0xc0)
    ;
  }
  else {
    sVar16 = strlen(pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_428,pcVar15,sVar16);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_428," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_428);
  std::ios_base::~ios_base(local_3b8);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_4e0->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((local_4e0->m_extension)._M_string_length != 0) {
    std::operator+(local_1a8,"#extension ",&local_4e0->m_extension);
    plVar17 = (long *)std::__cxx11::string::append((char *)local_1a8);
    pTVar21 = (TestLog *)(plVar17 + 2);
    if ((TestLog *)*plVar17 == pTVar21) {
      local_418._M_allocated_capacity = (size_type)pTVar21->m_log;
      local_418._8_8_ = plVar17[3];
      local_428 = (undefined1  [8])(auStack_420 + 8);
    }
    else {
      local_418._M_allocated_capacity = (size_type)pTVar21->m_log;
      local_428 = (undefined1  [8])*plVar17;
    }
    auStack_420 = (undefined1  [8])plVar17[1];
    *plVar17 = (long)pTVar21;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_428);
    if (local_428 != (undefined1  [8])(auStack_420 + 8)) {
      operator_delete((void *)local_428,(ulong)(local_418._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),1);
  makeSymbol<tcu::Matrix<float,2,2>>
            ((Symbol *)local_428,local_4e0,
             (local_4d8->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
             .m_ptr);
  uVar12 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_428);
  glu::VarType::operator=((VarType *)(uVar12 + 0x20),(VarType *)&local_408);
  glu::VarType::~VarType((VarType *)&local_408);
  if (local_428 != (undefined1  [8])(auStack_420 + 8)) {
    operator_delete((void *)local_428,(ulong)(local_418._M_allocated_capacity + 1));
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),1);
  makeSymbol<float>((Symbol *)local_428,local_4e0,
                    (local_4d8->out0).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar12 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_428);
  glu::VarType::operator=((VarType *)(uVar12 + 0x20),(VarType *)&local_408);
  glu::VarType::~VarType((VarType *)&local_408);
  if (local_428 != (undefined1  [8])(auStack_420 + 8)) {
    operator_delete((void *)local_428,(ulong)(local_418._M_allocated_capacity + 1));
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
  (*local_4c8->_vptr_Statement[2])(local_4c8,local_428);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_428);
  std::ios_base::~ios_base(local_3b8);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  pPVar10 = local_4e0;
  pSVar18 = ShaderExecUtil::createExecutor
                      ((local_4e0->m_ctx).renderContext,(local_4e0->m_ctx).shaderType,
                       (ShaderSpec *)local_220);
  local_428 = (undefined1  [8])
              (local_468->in0).
              super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  auStack_420 = (undefined1  [8])
                (local_468->in1).
                super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_418._M_allocated_capacity =
       (size_type)
       (local_468->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_418._8_8_ =
       (local_468->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8[0]._M_dataplus._M_p =
       (pointer)local_278.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_1a8[0]._M_string_length =
       (size_type)
       local_278.out1.
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (*pSVar18->_vptr_ShaderExecutor[3])
            (pSVar18,((pPVar10->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar13 = (*pSVar18->_vptr_ShaderExecutor[2])(pSVar18);
  if ((char)iVar13 != '\0') {
    (*pSVar18->_vptr_ShaderExecutor[5])(pSVar18);
    value = local_1a8;
    (*pSVar18->_vptr_ShaderExecutor[6])(pSVar18,uVar24 & 0xffffffff,local_428);
    (*pSVar18->_vptr_ShaderExecutor[1])(pSVar18);
    tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_428);
    pVVar11 = local_4d8;
    local_1a8[0]._M_dataplus._M_p = local_1a8[0]._M_dataplus._M_p & 0xffffffffffffff00;
    local_1a8[0]._M_string_length = 0x7ff0000000000000;
    local_1a8[0].field_2._M_allocated_capacity = 0xfff0000000000000;
    Environment::bind<tcu::Matrix<float,2,2>>
              ((Environment *)&local_2a8,
               (local_4d8->in0).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
               .m_ptr,(IVal *)local_428);
    Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
              ((Environment *)&local_2a8,
               (pVVar11->in1).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
               .m_ptr,(IVal *)local_498);
    Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
              ((Environment *)&local_2a8,
               (pVVar11->in2).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
               .m_ptr,(IVal *)&local_4b8);
    Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
              ((Environment *)&local_2a8,
               (pVVar11->in3).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
               .m_ptr,(IVal *)&local_458);
    Environment::bind<float>
              ((Environment *)&local_2a8,
               (pVVar11->out0).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,
               (IVal *)local_1a8);
    Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
              ((Environment *)&local_2a8,
               (pVVar11->out1).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
               .m_ptr,&local_4c9);
    local_440 = uVar24;
    if (pMVar6 == pMVar5) {
      local_4c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      local_460 = &(local_4e0->m_ctx).floatFormat;
      local_430 = &local_4e0->m_status;
      local_438 = uVar24 + (uVar24 == 0);
      uVar24 = 0;
      local_4c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      do {
        pPVar10 = local_4e0;
        local_458._0_8_ = local_458._0_8_ & 0xffffffffffffff00;
        local_458.m_lo = INFINITY;
        local_458.m_hi = -INFINITY;
        if ((uVar24 & 0xfff) == 0) {
          tcu::TestContext::touchWatchdog((local_4e0->super_TestCase).super_TestNode.m_testCtx);
        }
        fmt = local_460;
        round<tcu::Matrix<float,2,2>>
                  ((IVal *)local_1a8,(BuiltinPrecisionTests *)local_460,
                   (FloatFormat *)
                   ((local_468->in0).
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar24),(Matrix<float,_2,_2> *)value
                  );
        ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doConvert
                  ((IVal *)local_428,fmt,(IVal *)local_1a8);
        pIVar19 = (Interval *)
                  Environment::lookup<tcu::Matrix<float,2,2>>
                            ((Environment *)&local_2a8,
                             (local_4d8->in0).
                             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                             .m_ptr);
        pVVar11 = local_4d8;
        puVar22 = local_428;
        lVar23 = 0;
        do {
          lVar25 = 0;
          do {
            *(undefined8 *)((long)&pIVar19->m_hi + lVar25) =
                 *(undefined8 *)(puVar22 + lVar25 + 0x10);
            dVar29 = *(double *)((long)(puVar22 + lVar25) + 8);
            pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_2>,_2> *)&pIVar19->m_hasNaN)->m_data[0].
                      m_data[0].m_hasNaN + lVar25;
            *(undefined8 *)pbVar1 = *(undefined8 *)(puVar22 + lVar25);
            *(double *)(pbVar1 + 8) = dVar29;
            lVar25 = lVar25 + 0x30;
          } while (lVar25 == 0x30);
          pIVar19 = pIVar19 + 1;
          puVar22 = puVar22 + 0x18;
          bVar27 = lVar23 == 0;
          lVar23 = lVar23 + 1;
        } while (bVar27);
        Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                  ((Environment *)&local_2a8,
                   (local_4d8->in1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                   .m_ptr);
        Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                  ((Environment *)&local_2a8,
                   (pVVar11->in2).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                   .m_ptr);
        Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                  ((Environment *)&local_2a8,
                   (pVVar11->in3).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                   .m_ptr);
        local_400.basic.type = (pPVar10->m_ctx).precision;
        local_408 = local_460->m_maxValue;
        local_428 = *(undefined1 (*) [8])local_460;
        auStack_420 = *(undefined1 (*) [8])&local_460->m_fractionBits;
        local_418._M_allocated_capacity = *(undefined8 *)&local_460->m_hasInf;
        local_418._8_8_ = *(undefined8 *)&local_460->m_exactPrecision;
        local_3f0 = 0;
        local_400._8_8_ = &local_2a8;
        (*local_4c8->_vptr_Statement[3])(local_4c8,local_428);
        paVar3 = &local_1a8[0].field_2;
        x = Environment::lookup<float>
                      ((Environment *)&local_2a8,
                       (local_4d8->out0).
                       super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.
                       m_ptr);
        tcu::FloatFormat::convert((Interval *)local_428,&local_248,x);
        local_458.m_hi = (double)local_418._M_allocated_capacity;
        local_458._0_8_ = local_428;
        uVar12 = local_458._0_8_;
        local_458.m_lo = (double)auStack_420;
        fVar4 = local_278.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[uVar24];
        dVar28 = (double)fVar4;
        dVar29 = dVar28;
        if (NAN(fVar4)) {
          dVar29 = INFINITY;
          dVar28 = -INFINITY;
        }
        IVar26 = (IVal)(dVar28 <= (double)local_418._M_allocated_capacity &&
                       (double)auStack_420 <= dVar29);
        if ((NAN(fVar4)) &&
           (dVar28 <= (double)local_418._M_allocated_capacity && (double)auStack_420 <= dVar29)) {
          local_458.m_hasNaN = local_428[0];
          IVar26 = (IVal)local_458.m_hasNaN;
        }
        local_428 = (undefined1  [8])(auStack_420 + 8);
        local_458._0_8_ = uVar12;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_428,"Shader output 0 is outside acceptable range","");
        bVar27 = tcu::ResultCollector::check(local_430,(bool)((byte)IVar26 & 1),(string *)local_428)
        ;
        if (local_428 != (undefined1  [8])(auStack_420 + 8)) {
          operator_delete((void *)local_428,(ulong)(local_418._M_allocated_capacity + 1));
        }
        uVar20 = (int)local_4c0 + ((byte)~bVar27 & 1);
        value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)uVar20;
        local_4c0 = value;
        if ((int)uVar20 < 0x65 && !bVar27) {
          local_428 = (undefined1  [8])((local_4e0->super_TestCase).super_TestNode.m_testCtx)->m_log
          ;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_420);
          pcVar15 = "Failed";
          if (bVar27) {
            pcVar15 = "Passed";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_420,pcVar15,6);
          pVVar11 = local_4d8;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_420," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_420,"\t",1);
          pVVar7 = (pVVar11->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                   .m_ptr;
          pcVar8 = (pVVar7->m_name)._M_dataplus._M_p;
          local_1a8[0]._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1a8,pcVar8,pcVar8 + (pVVar7->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_420,local_1a8[0]._M_dataplus._M_p,
                     local_1a8[0]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_420," = ",3);
          valueToString<tcu::Matrix<float,2,2>>
                    ((string *)local_498,(BuiltinPrecisionTests *)&local_248,
                     (FloatFormat *)
                     ((local_468->in0).
                      super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar24),
                     (Matrix<float,_2,_2> *)value);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_420,(char *)local_498._0_8_,
                     CONCAT44(local_498._12_4_,local_498._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_420,"\n",1);
          if ((undefined1 *)local_498._0_8_ != local_498 + 0x10) {
            operator_delete((void *)local_498._0_8_,(ulong)(local_498._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != paVar3) {
            operator_delete(local_1a8[0]._M_dataplus._M_p,
                            local_1a8[0].field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_420,"\t",1);
          pVVar9 = (pVVar11->out0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
          pcVar8 = (pVVar9->m_name)._M_dataplus._M_p;
          local_1a8[0]._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1a8,pcVar8,pcVar8 + (pVVar9->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_420,local_1a8[0]._M_dataplus._M_p,
                     local_1a8[0]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_420," = ",3);
          valueToString<float>
                    ((string *)local_498,&local_248,
                     local_278.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar24);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_420,(char *)local_498._0_8_,
                     CONCAT44(local_498._12_4_,local_498._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_420,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_420,"\tExpected range: ",0x11);
          intervalToString<float>(&local_4b8,&local_248,&local_458);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_420,local_4b8._M_dataplus._M_p,local_4b8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_420,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
            operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_498._0_8_ != local_498 + 0x10) {
            operator_delete((void *)local_498._0_8_,(ulong)(local_498._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != paVar3) {
            operator_delete(local_1a8[0]._M_dataplus._M_p,
                            local_1a8[0].field_2._M_allocated_capacity + 1);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_428,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_420);
          std::ios_base::~ios_base(local_3b0);
        }
        uVar24 = uVar24 + 1;
      } while (uVar24 != local_438);
    }
    iVar13 = (int)local_4c0;
    if (100 < iVar13) {
      local_428 = (undefined1  [8])((local_4e0->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_420);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_420,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)auStack_420,iVar13 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_420," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_428,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_420);
      std::ios_base::~ios_base(local_3b0);
    }
    if (iVar13 == 0) {
      local_428 = (undefined1  [8])((local_4e0->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_420);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_420,"All ",4);
      std::ostream::_M_insert<unsigned_long>((ulong)auStack_420);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_420," inputs passed.",0xf);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_428,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_428 = (undefined1  [8])((local_4e0->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_420);
      std::ostream::operator<<((ostringstream *)auStack_420,iVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_420,"/",1);
      std::ostream::_M_insert<unsigned_long>((ulong)auStack_420);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_420," inputs failed.",0xf);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_428,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_420);
    std::ios_base::~ios_base(local_3b0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
    ::~_Rb_tree(&local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_p != &local_1b8) {
      operator_delete(local_1c8._M_p,
                      CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_p != &local_1d8) {
      operator_delete(local_1e8._M_p,
                      CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1)
      ;
    }
    std::
    vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>::
    ~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
    std::
    vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>::
    ~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
    if (local_278.out1.
        super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_278.out1.
                      super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_278.out1.
                            super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_278.out1.
                            super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_278.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_278.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_278.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_278.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Shader compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
             ,0x11d4);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}